

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

UBool __thiscall
icu_63::MessagePatternList<icu_63::MessagePattern::Part,_32>::equals
          (MessagePatternList<icu_63::MessagePattern::Part,_32> *this,
          MessagePatternList<icu_63::MessagePattern::Part,_32> *other,int32_t length)

{
  UBool UVar1;
  Part *this_00;
  Part *other_00;
  int local_28;
  int32_t i;
  int32_t length_local;
  MessagePatternList<icu_63::MessagePattern::Part,_32> *other_local;
  MessagePatternList<icu_63::MessagePattern::Part,_32> *this_local;
  
  local_28 = 0;
  while( true ) {
    if (length <= local_28) {
      return '\x01';
    }
    this_00 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::operator[](&this->a,(long)local_28)
    ;
    other_00 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::operator[]
                         (&other->a,(long)local_28);
    UVar1 = MessagePattern::Part::operator!=(this_00,other_00);
    if (UVar1 != '\0') break;
    local_28 = local_28 + 1;
  }
  return '\0';
}

Assistant:

UBool equals(const MessagePatternList<T, stackCapacity> &other, int32_t length) const {
        for(int32_t i=0; i<length; ++i) {
            if(a[i]!=other.a[i]) { return FALSE; }
        }
        return TRUE;
    }